

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O2

int CVodePrintAllStats(void *cvode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  ulong uVar1;
  int line;
  int error_code;
  char *msgfmt;
  long lVar2;
  ulong uVar3;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x9e1;
LAB_00123925:
    cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodePrintAllStats",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,msgfmt);
  }
  else {
    if (fmt == SUN_OUTPUTFORMAT_CSV) {
      fprintf((FILE *)outfile,"Time,%.16g",*(undefined8 *)((long)cvode_mem + 0x408));
      fprintf((FILE *)outfile,",Steps,%ld",*(undefined8 *)((long)cvode_mem + 0x628));
      fprintf((FILE *)outfile,",Error test fails,%ld",*(undefined8 *)((long)cvode_mem + 0x6a8));
      fprintf((FILE *)outfile,",NLS step fails,%ld",*(undefined8 *)((long)cvode_mem + 0x660));
      fprintf((FILE *)outfile,",Initial step size,%.16g",*(undefined8 *)((long)cvode_mem + 0x808));
      fprintf((FILE *)outfile,",Last step size,%.16g",*(undefined8 *)((long)cvode_mem + 0x810));
      fprintf((FILE *)outfile,",Current step size,%.16g",*(undefined8 *)((long)cvode_mem + 0x3f0));
      fprintf((FILE *)outfile,",Last method order,%d",(ulong)*(uint *)((long)cvode_mem + 0x7fc));
      fprintf((FILE *)outfile,",Current method order,%d",(ulong)*(uint *)((long)cvode_mem + 0x3c8));
      fprintf((FILE *)outfile,",Stab. lim. order reductions,%ld",
              *(undefined8 *)((long)cvode_mem + 0x950));
      fprintf((FILE *)outfile,",RHS fn evals,%ld",*(undefined8 *)((long)cvode_mem + 0x630));
      fprintf((FILE *)outfile,",NLS iters,%ld",*(undefined8 *)((long)cvode_mem + 0x678));
      fprintf((FILE *)outfile,",NLS fails,%ld",*(undefined8 *)((long)cvode_mem + 0x690));
      if (*(long *)((long)cvode_mem + 0x628) < 1) {
        fwrite(",NLS iters per step,0",0x15,1,(FILE *)outfile);
      }
      else {
        fprintf((FILE *)outfile,",NLS iters per step,%.16g",
                (double)*(long *)((long)cvode_mem + 0x678) /
                (double)*(long *)((long)cvode_mem + 0x628));
      }
      fprintf((FILE *)outfile,",LS setups,%ld",*(undefined8 *)((long)cvode_mem + 0x6c8));
      lVar2 = *(long *)((long)cvode_mem + 0x7e0);
      if (lVar2 != 0) {
        fprintf((FILE *)outfile,",Jac fn evals,%ld",*(undefined8 *)(lVar2 + 0x88));
        fprintf((FILE *)outfile,",LS RHS fn evals,%ld",*(undefined8 *)(lVar2 + 0x90));
        fprintf((FILE *)outfile,",Prec setup evals,%ld",*(undefined8 *)(lVar2 + 0xa0));
        fprintf((FILE *)outfile,",Prec solves,%ld",*(undefined8 *)(lVar2 + 0xb0));
        fprintf((FILE *)outfile,",LS iters,%ld",*(undefined8 *)(lVar2 + 0xa8));
        fprintf((FILE *)outfile,",LS fails,%ld",*(undefined8 *)(lVar2 + 0xb8));
        fprintf((FILE *)outfile,",Jac-times setups,%ld",*(undefined8 *)(lVar2 + 0xc0));
        fprintf((FILE *)outfile,",Jac-times evals,%ld",*(undefined8 *)(lVar2 + 200));
        if (*(long *)((long)cvode_mem + 0x678) < 1) {
          fwrite(",LS iters per NLS iter,0",0x18,1,(FILE *)outfile);
          fwrite(",Jac evals per NLS iter,0",0x19,1,(FILE *)outfile);
          fwrite(",Prec evals per NLS iter,0",0x1a,1,(FILE *)outfile);
        }
        else {
          fprintf((FILE *)outfile,",LS iters per NLS iter,%.16g",
                  (double)*(long *)(lVar2 + 0xa8) / (double)*(long *)((long)cvode_mem + 0x678));
          fprintf((FILE *)outfile,",Jac evals per NLS iter,%.16g",
                  (double)*(long *)(lVar2 + 0x88) / (double)*(long *)((long)cvode_mem + 0x678));
          fprintf((FILE *)outfile,",Prec evals per NLS iter,%.16g",
                  (double)*(long *)(lVar2 + 0xa0) / (double)*(long *)((long)cvode_mem + 0x678));
        }
      }
      fprintf((FILE *)outfile,",Root fn evals,%ld",*(undefined8 *)((long)cvode_mem + 0x9c0));
      lVar2 = *(long *)((long)cvode_mem + 0x9d8);
      if (lVar2 != 0) {
        fprintf((FILE *)outfile,",Projection fn evals,%ld",*(undefined8 *)(lVar2 + 0x40));
        fprintf((FILE *)outfile,",Projection fails,%ld",*(undefined8 *)(lVar2 + 0x48));
      }
      if (*(int *)((long)cvode_mem + 0x5c) != 0) {
        fprintf((FILE *)outfile,",Quad fn evals,%ld",*(undefined8 *)((long)cvode_mem + 0x638));
        fprintf((FILE *)outfile,",Quad error test fails,%ld",
                *(undefined8 *)((long)cvode_mem + 0x6b0));
      }
      if (*(int *)((long)cvode_mem + 0x8c) != 0) {
        fprintf((FILE *)outfile,",Sens fn evals,%ld",*(undefined8 *)((long)cvode_mem + 0x640));
        fprintf((FILE *)outfile,",Sens RHS fn evals,%ld",*(undefined8 *)((long)cvode_mem + 0x648));
        fprintf((FILE *)outfile,",Sens error test fails,%ld",
                *(undefined8 *)((long)cvode_mem + 0x6b8));
        if (*(int *)((long)cvode_mem + 0x94) != 1) {
          fprintf((FILE *)outfile,",Sens NLS iters,%ld",*(undefined8 *)((long)cvode_mem + 0x680));
          fprintf((FILE *)outfile,",Sens NLS fails,%ld",*(undefined8 *)((long)cvode_mem + 0x698));
          fprintf((FILE *)outfile,",Sens NLS step fails,%ld",
                  *(undefined8 *)((long)cvode_mem + 0x668));
          if (*(int *)((long)cvode_mem + 0x94) == 3) {
            for (uVar3 = 0; uVar1 = (ulong)*(int *)((long)cvode_mem + 0x90),
                (long)uVar3 < (long)uVar1; uVar3 = uVar3 + 1) {
              fprintf((FILE *)outfile,",Sens stgr1[%i] NLS iters,%ld",uVar3 & 0xffffffff,
                      *(undefined8 *)(*(long *)((long)cvode_mem + 0x688) + uVar3 * 8));
            }
            for (uVar3 = 0; (long)uVar3 < (long)(int)uVar1; uVar3 = uVar3 + 1) {
              fprintf((FILE *)outfile,",Sens stgr1[%i] NLS fails,%ld",uVar3 & 0xffffffff,
                      *(undefined8 *)(*(long *)((long)cvode_mem + 0x6a0) + uVar3 * 8));
              uVar1 = (ulong)*(uint *)((long)cvode_mem + 0x90);
            }
            for (uVar3 = 0; (long)uVar3 < (long)(int)uVar1; uVar3 = uVar3 + 1) {
              fprintf((FILE *)outfile,",Sens stgr1[%i] NLS step fails,%ld",uVar3 & 0xffffffff,
                      *(undefined8 *)(*(long *)((long)cvode_mem + 0x670) + uVar3 * 8));
              uVar1 = (ulong)*(uint *)((long)cvode_mem + 0x90);
            }
          }
        }
        fprintf((FILE *)outfile,",Sens LS setups,%ld",*(undefined8 *)((long)cvode_mem + 0x6d0));
      }
      if (*(int *)((long)cvode_mem + 0x108) != 0) {
        fprintf((FILE *)outfile,",QuadSens fn evals,%ld",*(undefined8 *)((long)cvode_mem + 0x650));
        fprintf((FILE *)outfile,",QuadSens error test fails,%ld",
                *(undefined8 *)((long)cvode_mem + 0x6c0));
      }
      fputc(10,(FILE *)outfile);
    }
    else {
      if (fmt != SUN_OUTPUTFORMAT_TABLE) {
        msgfmt = "Invalid formatting option.";
        error_code = -0x16;
        line = 0xad6;
        goto LAB_00123925;
      }
      fprintf((FILE *)outfile,"Current time                 = %.16g\n",
              *(undefined8 *)((long)cvode_mem + 0x408));
      fprintf((FILE *)outfile,"Steps                        = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x628));
      fprintf((FILE *)outfile,"Error test fails             = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x6a8));
      fprintf((FILE *)outfile,"NLS step fails               = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x660));
      fprintf((FILE *)outfile,"Initial step size            = %.16g\n",
              *(undefined8 *)((long)cvode_mem + 0x808));
      fprintf((FILE *)outfile,"Last step size               = %.16g\n",
              *(undefined8 *)((long)cvode_mem + 0x810));
      fprintf((FILE *)outfile,"Current step size            = %.16g\n",
              *(undefined8 *)((long)cvode_mem + 0x3f0));
      fprintf((FILE *)outfile,"Last method order            = %d\n",
              (ulong)*(uint *)((long)cvode_mem + 0x7fc));
      fprintf((FILE *)outfile,"Current method order         = %d\n",
              (ulong)*(uint *)((long)cvode_mem + 0x3c8));
      fprintf((FILE *)outfile,"Stab. lim. order reductions  = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x950));
      fprintf((FILE *)outfile,"RHS fn evals                 = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x630));
      fprintf((FILE *)outfile,"NLS iters                    = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x678));
      fprintf((FILE *)outfile,"NLS fails                    = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x690));
      if (0 < *(long *)((long)cvode_mem + 0x628)) {
        fprintf((FILE *)outfile,"NLS iters per step           = %.16g\n",
                (double)*(long *)((long)cvode_mem + 0x678) /
                (double)*(long *)((long)cvode_mem + 0x628));
      }
      fprintf((FILE *)outfile,"LS setups                    = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x6c8));
      lVar2 = *(long *)((long)cvode_mem + 0x7e0);
      if (lVar2 != 0) {
        fprintf((FILE *)outfile,"Jac fn evals                 = %ld\n",*(undefined8 *)(lVar2 + 0x88)
               );
        fprintf((FILE *)outfile,"LS RHS fn evals              = %ld\n",*(undefined8 *)(lVar2 + 0x90)
               );
        fprintf((FILE *)outfile,"Prec setup evals             = %ld\n",*(undefined8 *)(lVar2 + 0xa0)
               );
        fprintf((FILE *)outfile,"Prec solves                  = %ld\n",*(undefined8 *)(lVar2 + 0xb0)
               );
        fprintf((FILE *)outfile,"LS iters                     = %ld\n",*(undefined8 *)(lVar2 + 0xa8)
               );
        fprintf((FILE *)outfile,"LS fails                     = %ld\n",*(undefined8 *)(lVar2 + 0xb8)
               );
        fprintf((FILE *)outfile,"Jac-times setups             = %ld\n",*(undefined8 *)(lVar2 + 0xc0)
               );
        fprintf((FILE *)outfile,"Jac-times evals              = %ld\n",*(undefined8 *)(lVar2 + 200))
        ;
        if (0 < *(long *)((long)cvode_mem + 0x678)) {
          fprintf((FILE *)outfile,"LS iters per NLS iter        = %.16g\n",
                  (double)*(long *)(lVar2 + 0xa8) / (double)*(long *)((long)cvode_mem + 0x678));
          fprintf((FILE *)outfile,"Jac evals per NLS iter       = %.16g\n",
                  (double)*(long *)(lVar2 + 0x88) / (double)*(long *)((long)cvode_mem + 0x678));
          fprintf((FILE *)outfile,"Prec evals per NLS iter      = %.16g\n",
                  (double)*(long *)(lVar2 + 0xa0) / (double)*(long *)((long)cvode_mem + 0x678));
        }
      }
      fprintf((FILE *)outfile,"Root fn evals                = %ld\n",
              *(undefined8 *)((long)cvode_mem + 0x9c0));
      lVar2 = *(long *)((long)cvode_mem + 0x9d8);
      if (lVar2 != 0) {
        fprintf((FILE *)outfile,"Projection fn evals          = %ld\n",*(undefined8 *)(lVar2 + 0x40)
               );
        fprintf((FILE *)outfile,"Projection fails             = %ld\n",*(undefined8 *)(lVar2 + 0x48)
               );
      }
      if (*(int *)((long)cvode_mem + 0x5c) != 0) {
        fprintf((FILE *)outfile,"Quad fn evals                = %ld\n",
                *(undefined8 *)((long)cvode_mem + 0x638));
        fprintf((FILE *)outfile,"Quad error test fails        = %ld\n",
                *(undefined8 *)((long)cvode_mem + 0x6b0));
      }
      if (*(int *)((long)cvode_mem + 0x8c) != 0) {
        fprintf((FILE *)outfile,"Sens fn evals                = %ld\n",
                *(undefined8 *)((long)cvode_mem + 0x640));
        fprintf((FILE *)outfile,"Sens RHS fn evals            = %ld\n",
                *(undefined8 *)((long)cvode_mem + 0x648));
        fprintf((FILE *)outfile,"Sens error test fails        = %ld\n",
                *(undefined8 *)((long)cvode_mem + 0x6b8));
        if (*(int *)((long)cvode_mem + 0x94) != 1) {
          fprintf((FILE *)outfile,"Sens NLS iters               = %ld\n",
                  *(undefined8 *)((long)cvode_mem + 0x680));
          fprintf((FILE *)outfile,"Sens NLS fails               = %ld\n",
                  *(undefined8 *)((long)cvode_mem + 0x698));
          fprintf((FILE *)outfile,"Sens NLS step fails          = %ld\n",
                  *(undefined8 *)((long)cvode_mem + 0x668));
          if (*(int *)((long)cvode_mem + 0x94) == 3) {
            fprintf((FILE *)outfile,"Sens stgr1 NLS iters         = %ld",
                    **(undefined8 **)((long)cvode_mem + 0x688));
            for (lVar2 = 1; lVar2 < *(int *)((long)cvode_mem + 0x90); lVar2 = lVar2 + 1) {
              fprintf((FILE *)outfile,", %ld",
                      *(undefined8 *)(*(long *)((long)cvode_mem + 0x688) + lVar2 * 8));
            }
            fputc(10,(FILE *)outfile);
            fprintf((FILE *)outfile,"Sens stgr1 NLS fails         = %ld",
                    **(undefined8 **)((long)cvode_mem + 0x6a0));
            for (lVar2 = 1; lVar2 < *(int *)((long)cvode_mem + 0x90); lVar2 = lVar2 + 1) {
              fprintf((FILE *)outfile,", %ld",
                      *(undefined8 *)(*(long *)((long)cvode_mem + 0x6a0) + lVar2 * 8));
            }
            fputc(10,(FILE *)outfile);
            fprintf((FILE *)outfile,"Sens stgr1 NLS step fails    = %ld",
                    **(undefined8 **)((long)cvode_mem + 0x670));
            for (lVar2 = 1; lVar2 < *(int *)((long)cvode_mem + 0x90); lVar2 = lVar2 + 1) {
              fprintf((FILE *)outfile,", %ld",
                      *(undefined8 *)(*(long *)((long)cvode_mem + 0x670) + lVar2 * 8));
            }
            fputc(10,(FILE *)outfile);
          }
        }
        fprintf((FILE *)outfile,"Sens LS setups               = %ld\n",
                *(undefined8 *)((long)cvode_mem + 0x6d0));
      }
      if (*(int *)((long)cvode_mem + 0x108) != 0) {
        fprintf((FILE *)outfile,"QuadSens fn evals            = %ld\n",
                *(undefined8 *)((long)cvode_mem + 0x650));
        fprintf((FILE *)outfile,"QuadSens error test fails    = %ld\n",
                *(undefined8 *)((long)cvode_mem + 0x6c0));
        return 0;
      }
    }
    error_code = 0;
  }
  return error_code;
}

Assistant:

int CVodePrintAllStats(void* cvode_mem, FILE* outfile, SUNOutputFormat fmt)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeProjMem cvproj_mem;
  int is;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  switch (fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    /* step and method stats */
    fprintf(outfile, "Current time                 = %" RSYM "\n", cv_mem->cv_tn);
    fprintf(outfile, "Steps                        = %ld\n", cv_mem->cv_nst);
    fprintf(outfile, "Error test fails             = %ld\n", cv_mem->cv_netf);
    fprintf(outfile, "NLS step fails               = %ld\n", cv_mem->cv_ncfn);
    fprintf(outfile, "Initial step size            = %" RSYM "\n",
            cv_mem->cv_h0u);
    fprintf(outfile, "Last step size               = %" RSYM "\n", cv_mem->cv_hu);
    fprintf(outfile, "Current step size            = %" RSYM "\n",
            cv_mem->cv_next_h);
    fprintf(outfile, "Last method order            = %d\n", cv_mem->cv_qu);
    fprintf(outfile, "Current method order         = %d\n", cv_mem->cv_next_q);
    fprintf(outfile, "Stab. lim. order reductions  = %ld\n", cv_mem->cv_nor);

    /* function evaluations */
    fprintf(outfile, "RHS fn evals                 = %ld\n", cv_mem->cv_nfe);

    /* nonlinear solver stats */
    fprintf(outfile, "NLS iters                    = %ld\n", cv_mem->cv_nni);
    fprintf(outfile, "NLS fails                    = %ld\n", cv_mem->cv_nnf);
    if (cv_mem->cv_nst > 0)
    {
      fprintf(outfile, "NLS iters per step           = %" RSYM "\n",
              (sunrealtype)cv_mem->cv_nni / (sunrealtype)cv_mem->cv_nst);
    }

    /* linear solver stats */
    fprintf(outfile, "LS setups                    = %ld\n", cv_mem->cv_nsetups);
    if (cv_mem->cv_lmem)
    {
      cvls_mem = (CVLsMem)(cv_mem->cv_lmem);
      fprintf(outfile, "Jac fn evals                 = %ld\n", cvls_mem->nje);
      fprintf(outfile, "LS RHS fn evals              = %ld\n", cvls_mem->nfeDQ);
      fprintf(outfile, "Prec setup evals             = %ld\n", cvls_mem->npe);
      fprintf(outfile, "Prec solves                  = %ld\n", cvls_mem->nps);
      fprintf(outfile, "LS iters                     = %ld\n", cvls_mem->nli);
      fprintf(outfile, "LS fails                     = %ld\n", cvls_mem->ncfl);
      fprintf(outfile, "Jac-times setups             = %ld\n",
              cvls_mem->njtsetup);
      fprintf(outfile, "Jac-times evals              = %ld\n", cvls_mem->njtimes);
      if (cv_mem->cv_nni > 0)
      {
        fprintf(outfile, "LS iters per NLS iter        = %" RSYM "\n",
                (sunrealtype)cvls_mem->nli / (sunrealtype)cv_mem->cv_nni);
        fprintf(outfile, "Jac evals per NLS iter       = %" RSYM "\n",
                (sunrealtype)cvls_mem->nje / (sunrealtype)cv_mem->cv_nni);
        fprintf(outfile, "Prec evals per NLS iter      = %" RSYM "\n",
                (sunrealtype)cvls_mem->npe / (sunrealtype)cv_mem->cv_nni);
      }
    }

    /* rootfinding stats */
    fprintf(outfile, "Root fn evals                = %ld\n", cv_mem->cv_nge);

    /* projection stats */
    if (cv_mem->proj_mem)
    {
      cvproj_mem = (CVodeProjMem)(cv_mem->proj_mem);
      fprintf(outfile, "Projection fn evals          = %ld\n", cvproj_mem->nproj);
      fprintf(outfile, "Projection fails             = %ld\n",
              cvproj_mem->npfails);
    }

    /* quadrature stats */
    if (cv_mem->cv_quadr)
    {
      fprintf(outfile, "Quad fn evals                = %ld\n", cv_mem->cv_nfQe);
      fprintf(outfile, "Quad error test fails        = %ld\n", cv_mem->cv_netfQ);
    }

    /* sensitivity stats */
    if (cv_mem->cv_sensi)
    {
      fprintf(outfile, "Sens fn evals                = %ld\n", cv_mem->cv_nfSe);
      fprintf(outfile, "Sens RHS fn evals            = %ld\n", cv_mem->cv_nfeS);
      fprintf(outfile, "Sens error test fails        = %ld\n", cv_mem->cv_netfS);
      if (cv_mem->cv_ism != CV_SIMULTANEOUS)
      {
        fprintf(outfile, "Sens NLS iters               = %ld\n", cv_mem->cv_nniS);
        fprintf(outfile, "Sens NLS fails               = %ld\n", cv_mem->cv_nnfS);
        fprintf(outfile, "Sens NLS step fails          = %ld\n",
                cv_mem->cv_ncfnS);
      }
      if (cv_mem->cv_ism == CV_STAGGERED1)
      {
        fprintf(outfile, "Sens stgr1 NLS iters         = %ld",
                cv_mem->cv_nniS1[0]);
        for (is = 1; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ", %ld", cv_mem->cv_nniS1[is]);
        }
        fprintf(outfile, "\n");
        fprintf(outfile, "Sens stgr1 NLS fails         = %ld",
                cv_mem->cv_nnfS1[0]);
        for (is = 1; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ", %ld", cv_mem->cv_nnfS1[is]);
        }
        fprintf(outfile, "\n");
        fprintf(outfile, "Sens stgr1 NLS step fails    = %ld",
                cv_mem->cv_ncfnS1[0]);
        for (is = 1; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ", %ld", cv_mem->cv_ncfnS1[is]);
        }
        fprintf(outfile, "\n");
      }
      fprintf(outfile, "Sens LS setups               = %ld\n",
              cv_mem->cv_nsetupsS);
    }

    /* quadrature-sensitivity stats */
    if (cv_mem->cv_quadr_sensi)
    {
      fprintf(outfile, "QuadSens fn evals            = %ld\n", cv_mem->cv_nfQSe);
      fprintf(outfile, "QuadSens error test fails    = %ld\n", cv_mem->cv_netfQS);
    }
    break;

  case SUN_OUTPUTFORMAT_CSV:
    /* step and method stats */
    fprintf(outfile, "Time,%" RSYM, cv_mem->cv_tn);
    fprintf(outfile, ",Steps,%ld", cv_mem->cv_nst);
    fprintf(outfile, ",Error test fails,%ld", cv_mem->cv_netf);
    fprintf(outfile, ",NLS step fails,%ld", cv_mem->cv_ncfn);
    fprintf(outfile, ",Initial step size,%" RSYM, cv_mem->cv_h0u);
    fprintf(outfile, ",Last step size,%" RSYM, cv_mem->cv_hu);
    fprintf(outfile, ",Current step size,%" RSYM, cv_mem->cv_next_h);
    fprintf(outfile, ",Last method order,%d", cv_mem->cv_qu);
    fprintf(outfile, ",Current method order,%d", cv_mem->cv_next_q);
    fprintf(outfile, ",Stab. lim. order reductions,%ld", cv_mem->cv_nor);

    /* function evaluations */
    fprintf(outfile, ",RHS fn evals,%ld", cv_mem->cv_nfe);

    /* nonlinear solver stats */
    fprintf(outfile, ",NLS iters,%ld", cv_mem->cv_nni);
    fprintf(outfile, ",NLS fails,%ld", cv_mem->cv_nnf);
    if (cv_mem->cv_nst > 0)
    {
      fprintf(outfile, ",NLS iters per step,%" RSYM,
              (sunrealtype)cv_mem->cv_nni / (sunrealtype)cv_mem->cv_nst);
    }
    else { fprintf(outfile, ",NLS iters per step,0"); }

    /* linear solver stats */
    fprintf(outfile, ",LS setups,%ld", cv_mem->cv_nsetups);
    if (cv_mem->cv_lmem)
    {
      cvls_mem = (CVLsMem)(cv_mem->cv_lmem);
      fprintf(outfile, ",Jac fn evals,%ld", cvls_mem->nje);
      fprintf(outfile, ",LS RHS fn evals,%ld", cvls_mem->nfeDQ);
      fprintf(outfile, ",Prec setup evals,%ld", cvls_mem->npe);
      fprintf(outfile, ",Prec solves,%ld", cvls_mem->nps);
      fprintf(outfile, ",LS iters,%ld", cvls_mem->nli);
      fprintf(outfile, ",LS fails,%ld", cvls_mem->ncfl);
      fprintf(outfile, ",Jac-times setups,%ld", cvls_mem->njtsetup);
      fprintf(outfile, ",Jac-times evals,%ld", cvls_mem->njtimes);
      if (cv_mem->cv_nni > 0)
      {
        fprintf(outfile, ",LS iters per NLS iter,%" RSYM,
                (sunrealtype)cvls_mem->nli / (sunrealtype)cv_mem->cv_nni);
        fprintf(outfile, ",Jac evals per NLS iter,%" RSYM,
                (sunrealtype)cvls_mem->nje / (sunrealtype)cv_mem->cv_nni);
        fprintf(outfile, ",Prec evals per NLS iter,%" RSYM,
                (sunrealtype)cvls_mem->npe / (sunrealtype)cv_mem->cv_nni);
      }
      else
      {
        fprintf(outfile, ",LS iters per NLS iter,0");
        fprintf(outfile, ",Jac evals per NLS iter,0");
        fprintf(outfile, ",Prec evals per NLS iter,0");
      }
    }

    /* rootfinding stats */
    fprintf(outfile, ",Root fn evals,%ld", cv_mem->cv_nge);

    /* projection stats */
    if (cv_mem->proj_mem)
    {
      cvproj_mem = (CVodeProjMem)(cv_mem->proj_mem);
      fprintf(outfile, ",Projection fn evals,%ld", cvproj_mem->nproj);
      fprintf(outfile, ",Projection fails,%ld", cvproj_mem->npfails);
    }

    /* quadrature stats */
    if (cv_mem->cv_quadr)
    {
      fprintf(outfile, ",Quad fn evals,%ld", cv_mem->cv_nfQe);
      fprintf(outfile, ",Quad error test fails,%ld", cv_mem->cv_netfQ);
    }

    /* sensitivity stats */
    if (cv_mem->cv_sensi)
    {
      fprintf(outfile, ",Sens fn evals,%ld", cv_mem->cv_nfSe);
      fprintf(outfile, ",Sens RHS fn evals,%ld", cv_mem->cv_nfeS);
      fprintf(outfile, ",Sens error test fails,%ld", cv_mem->cv_netfS);
      if (cv_mem->cv_ism != CV_SIMULTANEOUS)
      {
        fprintf(outfile, ",Sens NLS iters,%ld", cv_mem->cv_nniS);
        fprintf(outfile, ",Sens NLS fails,%ld", cv_mem->cv_nnfS);
        fprintf(outfile, ",Sens NLS step fails,%ld", cv_mem->cv_ncfnS);
      }
      if (cv_mem->cv_ism == CV_STAGGERED1)
      {
        for (is = 0; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ",Sens stgr1[%i] NLS iters,%ld", is,
                  cv_mem->cv_nniS1[is]);
        }
        for (is = 0; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ",Sens stgr1[%i] NLS fails,%ld", is,
                  cv_mem->cv_nnfS1[is]);
        }
        for (is = 0; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ",Sens stgr1[%i] NLS step fails,%ld", is,
                  cv_mem->cv_ncfnS1[is]);
        }
      }
      fprintf(outfile, ",Sens LS setups,%ld", cv_mem->cv_nsetupsS);
    }

    /* quadrature-sensitivity stats */
    if (cv_mem->cv_quadr_sensi)
    {
      fprintf(outfile, ",QuadSens fn evals,%ld", cv_mem->cv_nfQSe);
      fprintf(outfile, ",QuadSens error test fails,%ld", cv_mem->cv_netfQS);
    }
    fprintf(outfile, "\n");
    break;

  default:
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid formatting option.");
    return (CV_ILL_INPUT);
  }

  return (CV_SUCCESS);
}